

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O0

void __thiscall
vkt::QueryPool::anon_unknown_0::TessellationShaderTestInstance::checkExtensions
          (TessellationShaderTestInstance *this)

{
  VkPhysicalDeviceFeatures *pVVar1;
  NotSupportedError *this_00;
  allocator<char> local_31;
  string local_30;
  TessellationShaderTestInstance *local_10;
  TessellationShaderTestInstance *this_local;
  
  local_10 = this;
  StatisticQueryTestInstance::checkExtensions((StatisticQueryTestInstance *)this);
  pVVar1 = Context::getDeviceFeatures
                     ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                      super_TestInstance.m_context);
  if (pVVar1->tessellationShader == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Tessellation shader are not supported",&local_31);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  return;
}

Assistant:

void TessellationShaderTestInstance::checkExtensions (void)
{
	StatisticQueryTestInstance::checkExtensions();
	if (!m_context.getDeviceFeatures().tessellationShader)
		throw tcu::NotSupportedError("Tessellation shader are not supported");
}